

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_ptr.hpp
# Opt level: O1

qsbr_ptr<const_char> * __thiscall
unodb::qsbr_ptr<const_char>::operator-=(qsbr_ptr<const_char> *this,difference_type n)

{
  pointer pcVar1;
  
  detail::qsbr_ptr_base::unregister_active_ptr(this->ptr);
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + -n;
  detail::qsbr_ptr_base::register_active_ptr(pcVar1 + -n);
  return this;
}

Assistant:

constexpr qsbr_ptr &operator-=(difference_type n) noexcept {
#ifndef NDEBUG
    unregister_active_ptr(ptr);
#endif
    ptr -= n;
#ifndef NDEBUG
    register_active_ptr(ptr);
#endif
    return *this;
  }